

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message.c++
# Opt level: O1

void __thiscall capnp::FlatMessageBuilder::~FlatMessageBuilder(FlatMessageBuilder *this)

{
  (this->super_MessageBuilder)._vptr_MessageBuilder =
       (_func_int **)&PTR__FlatMessageBuilder_0026bd30;
  if ((this->super_MessageBuilder).allocatedArena == true) {
    _::BuilderArena::~BuilderArena((BuilderArena *)(this->super_MessageBuilder).arenaSpace);
  }
  operator_delete(this,0xd8);
  return;
}

Assistant:

FlatMessageBuilder::~FlatMessageBuilder() noexcept(false) {}